

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O3

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  ushort uVar1;
  ZSTD_longLengthType_e ZVar2;
  bool bVar3;
  undefined8 uVar4;
  uint *workspace;
  void *pvVar5;
  U32 UVar6;
  int iVar7;
  byte *pbVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  byte *pbVar13;
  byte *pbVar14;
  U32 UVar15;
  FSE_CTable *pFVar16;
  U32 UVar17;
  ulong uVar18;
  size_t __n;
  uint uVar19;
  size_t err_code;
  byte *pbVar20;
  seqDef *psVar21;
  symbolEncodingType_e sVar22;
  size_t nbSeq;
  long lVar23;
  U32 UVar24;
  U16 *pUVar25;
  U32 UVar26;
  uint uVar27;
  undefined4 in_register_0000008c;
  U8 *workspace_00;
  size_t sVar28;
  seqDef *sequences;
  size_t err_code_3;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined4 in_stack_fffffffffffffd88;
  uint uVar34;
  BYTE *local_248;
  undefined8 local_240;
  U32 local_238;
  ZSTD_CCtx *local_230;
  byte *local_228;
  seqDef *local_220;
  long local_218;
  ulong local_210;
  ZSTD_compressedBlockState_t *local_208;
  uint local_1fc;
  U32 *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  seqDef *local_1e0;
  void *local_1d8;
  FSE_CTable *local_1d0;
  FSE_CTable *local_1c8;
  ZSTD_fseCTables_t *local_1c0;
  uint *local_1b8;
  ZSTD_compressedBlockState_t *local_1b0;
  void *local_1a8;
  ulong local_1a0;
  undefined8 local_198;
  size_t local_190;
  BYTE *local_188;
  seqDef *local_180;
  void *local_178;
  seqDef *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_198 = CONCAT44(in_register_0000008c,lastBlock);
  workspace_00 = (U8 *)zc->entropyWorkspace;
  pbVar8 = (byte *)ZSTD_buildBlockEntropyStats
                             (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                              &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                              &entropyMetadata,workspace_00,0x22d8);
  if ((byte *)0xffffffffffffff88 < pbVar8) {
    return (size_t)pbVar8;
  }
  local_1b0 = (zc->blockState).prevCBlock;
  local_208 = (zc->blockState).nextCBlock;
  local_1a0 = (ulong)(uint)zc->bmi2;
  local_1b8 = zc->entropyWorkspace;
  sequences = (zc->seqStore).sequencesStart;
  local_180 = (zc->seqStore).sequences;
  local_248 = (zc->seqStore).litStart;
  local_188 = (zc->seqStore).lit;
  local_1a8 = (void *)(srcSize + (long)src);
  local_218 = dstCapacity + (long)dst;
  local_1e8 = (zc->seqStore).llCode;
  local_1f0 = (zc->seqStore).mlCode;
  local_1f8 = (U32 *)(zc->seqStore).ofCode;
  bVar32 = entropyMetadata.hufMetadata.hType == set_compressed;
  local_190 = (zc->appliedParams).targetCBlockSize;
  local_1fc = (uint)(zc->bmi2 != 0);
  local_170 = local_180 + -1;
  local_1c0 = &(local_208->entropy).fse;
  pFVar16 = (local_208->entropy).fse.litlengthCTable;
  local_1d0 = (local_208->entropy).fse.matchlengthCTable;
  bVar3 = true;
  nbSeq = 0;
  uVar30 = 0;
  local_230 = zc;
  local_228 = (byte *)dst;
  local_220 = sequences;
  local_1d8 = src;
  local_1c8 = pFVar16;
  local_178 = dst;
  do {
    uVar11 = uVar30;
    if (local_220 == local_180) {
LAB_00694f0c:
      if (local_188 < local_248) {
        __assert_fail("lp <= lend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                      ,0x1db,
                      "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                     );
      }
      uVar30 = (long)local_188 - (long)local_248;
      uVar34 = (uint)CONCAT71((int7)((ulong)pFVar16 >> 8),1);
      if (uVar30 < uVar11) {
        __assert_fail("litSize <= (size_t)(lend - lp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                      ,0x1dc,
                      "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                     );
      }
    }
    else {
      psVar21 = sequences + nbSeq;
      uVar1 = psVar21->litLength;
      uVar34 = (uint)uVar1;
      if ((zc->seqStore).longLengthPos ==
          (U32)((ulong)((long)psVar21 - (long)(zc->seqStore).sequencesStart) >> 3)) {
        uVar34 = uVar1 + 0x10000;
        if ((zc->seqStore).longLengthType != ZSTD_llt_literalLength) {
          uVar34 = (uint)uVar1;
        }
      }
      pFVar16 = (FSE_CTable *)(ulong)uVar34;
      uVar30 = uVar30 + (long)pFVar16;
      nbSeq = nbSeq + 1;
      uVar11 = uVar30;
      if (psVar21 == local_170) goto LAB_00694f0c;
      uVar34 = 0;
    }
    local_240 = CONCAT44(local_240._4_4_,0xff);
    sVar28 = uVar30;
    if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
      workspace_00 = (U8 *)0x22d8;
      sVar12 = HIST_count_wksp(local_1b8,(uint *)&local_240,local_248,uVar30,local_1b8,0x22d8);
      if (sVar12 < 0xffffffffffffff89) {
        sVar12 = HUF_estimateCompressedSize((HUF_CElt *)local_208,local_1b8,(uint)local_240);
        sVar28 = entropyMetadata.hufMetadata.hufDesSize;
        if (!bVar32) {
          sVar28 = 0;
        }
        sVar28 = sVar12 + sVar28 + 3;
      }
    }
    else if (entropyMetadata.hufMetadata.hType != set_basic) {
      if (entropyMetadata.hufMetadata.hType != set_rle) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                      ,0x145,
                      "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                     );
      }
      sVar28 = 1;
    }
    workspace = local_1b8;
    if (nbSeq == 0) {
      pFVar16 = (FSE_CTable *)(ulong)uVar34;
      lVar29 = 0;
      uVar11 = 0;
      local_1e0 = sequences;
      if (local_190 < sVar28 + 6 || (char)uVar34 != '\0') goto LAB_006951e7;
      nbSeq = 0;
    }
    else {
      local_1e0 = (seqDef *)
                  ZSTD_estimateSubBlockSize_symbolType
                            (entropyMetadata.fseMetadata.ofType,(BYTE *)local_1f8,0x1f,nbSeq,
                             local_1c0->offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,local_1b8,
                             CONCAT44(uVar34,in_stack_fffffffffffffd88));
      sVar9 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.llType,local_1e8,0x23,nbSeq,local_1c8,"",
                         LL_defaultNorm,6,0x23,workspace,CONCAT44(uVar34,in_stack_fffffffffffffd88))
      ;
      workspace_00 = "";
      sVar10 = ZSTD_estimateSubBlockSize_symbolType
                         (entropyMetadata.fseMetadata.mlType,local_1f0,0x34,nbSeq,local_1d0,"",
                          ML_defaultNorm,6,0x34,workspace,CONCAT44(uVar34,in_stack_fffffffffffffd88)
                         );
      sVar12 = 0;
      if (bVar3) {
        sVar12 = entropyMetadata.fseMetadata.fseTablesSize;
      }
      pFVar16 = (FSE_CTable *)(ulong)uVar34;
      if (local_190 < (long)&local_1e0->mlBase + sVar12 + sVar9 + sVar10 + sVar28 ||
          (char)uVar34 != '\0') {
        local_1e0 = sequences + nbSeq;
        if ((long)nbSeq < 1) {
          lVar29 = 0;
          uVar11 = 0;
        }
        else {
          uVar18 = (long)sequences - (long)(zc->seqStore).sequencesStart;
          lVar23 = nbSeq * 8;
          pUVar25 = &sequences->mlBase;
          lVar29 = 0;
          uVar11 = 0;
          do {
            uVar1 = pUVar25[-1];
            uVar27 = *pUVar25 + 3;
            uVar19 = (uint)uVar1;
            if ((zc->seqStore).longLengthPos == (U32)(uVar18 >> 3)) {
              ZVar2 = (zc->seqStore).longLengthType;
              uVar19 = uVar1 + 0x10000;
              if (ZVar2 != ZSTD_llt_literalLength) {
                uVar19 = (uint)uVar1;
              }
              if (ZVar2 == ZSTD_llt_matchLength) {
                uVar27 = *pUVar25 + 0x10003;
              }
            }
            workspace_00 = (U8 *)(ulong)uVar27;
            lVar29 = lVar29 + (long)workspace_00;
            uVar11 = uVar11 + uVar19;
            uVar18 = uVar18 + 8;
            lVar23 = lVar23 + -8;
            pUVar25 = pUVar25 + 4;
          } while (0 < lVar23);
          pFVar16 = (FSE_CTable *)(ulong)uVar34;
          if (uVar30 < uVar11) {
            __assert_fail("litLengthSum <= litSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                          ,0x91,
                          "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                         );
          }
        }
LAB_006951e7:
        if (uVar11 != uVar30 && (char)pFVar16 == '\0') {
          __assert_fail("litLengthSum == litSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x93,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        bVar33 = (int)local_198 != 0;
        pbVar8 = local_228 + 3;
        sVar28 = (local_218 - (long)local_228) - 3;
        lVar23 = 0;
        if (bVar32) {
          lVar23 = 200;
        }
        sVar22 = set_repeat;
        if (bVar32) {
          sVar22 = entropyMetadata.hufMetadata.hType;
        }
        lVar23 = (ulong)(0x4000U - lVar23 <= uVar30) - (ulong)(uVar30 < 0x400U - lVar23);
        if (uVar30 == 0) goto LAB_00695362;
        if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
          pbVar13 = local_228 + lVar23 + 7;
          if (entropyMetadata.hufMetadata.hType == set_compressed && bVar32) {
            memcpy(pbVar13,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            local_210 = entropyMetadata.hufMetadata.hufDesSize;
            pbVar13 = pbVar13 + entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            local_210 = 0;
          }
          uVar11 = lVar23 + 4;
          if (uVar11 == 3) {
            workspace_00 = (U8 *)(ulong)local_1fc;
            sVar12 = HUF_compress1X_usingCTable
                               (pbVar13,local_218 - (long)pbVar13,local_248,uVar30,
                                (HUF_CElt *)local_208,local_1fc);
          }
          else {
            workspace_00 = (U8 *)(ulong)local_1fc;
            sVar12 = HUF_compress4X_usingCTable
                               (pbVar13,local_218 - (long)pbVar13,local_248,uVar30,
                                (HUF_CElt *)local_208,local_1fc);
          }
          if (sVar12 - 1 < 0xffffffffffffff88) {
            uVar18 = local_210 + sVar12;
            if ((!bVar32) && (uVar30 <= uVar18)) {
LAB_00695362:
              pbVar13 = (byte *)ZSTD_noCompressLiterals(pbVar8,sVar28,local_248,uVar30);
              goto LAB_0069536a;
            }
            if (uVar11 < ((ulong)(0x3ff < uVar18) - (ulong)(uVar18 < 0x4000)) + 4) {
              if (uVar18 <= uVar30) {
                __assert_fail("cLitSize > litSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                              ,0x5e,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
              goto LAB_00695362;
            }
            iVar7 = (int)uVar30 * 0x10;
            uVar27 = (uint)uVar18;
            if (uVar11 == 5) {
              *(symbolEncodingType_e *)(local_228 + 3) = uVar27 * 0x400000 + sVar22 + iVar7 + 0xc;
              local_228[7] = (byte)(uVar27 >> 10);
            }
            else if (uVar11 == 4) {
              *(symbolEncodingType_e *)pbVar8 = uVar27 * 0x40000 + sVar22 + iVar7 + 8;
            }
            else {
              iVar7 = uVar27 * 0x4000 + sVar22 + iVar7;
              *(short *)(local_228 + 3) = (short)iVar7;
              local_228[5] = (byte)((uint)iVar7 >> 0x10);
            }
            pbVar13 = pbVar13 + (sVar12 - (long)pbVar8);
            workspace_00 = (U8 *)0x0;
            goto LAB_00695370;
          }
LAB_006956e3:
          pFVar16 = (FSE_CTable *)(ulong)uVar34;
          zc = local_230;
        }
        else {
          if (entropyMetadata.hufMetadata.hType != set_rle) {
            if (entropyMetadata.hufMetadata.hType != set_basic) {
              __assert_fail("hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                            ,0x45,
                            "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                           );
            }
            goto LAB_00695362;
          }
          pbVar13 = (byte *)ZSTD_compressRleLiteralsBlock(pbVar8,sVar28,local_248,uVar30);
LAB_0069536a:
          workspace_00 = (U8 *)CONCAT71((int7)((ulong)workspace_00 >> 8),1);
LAB_00695370:
          if ((byte *)0xffffffffffffff88 < pbVar13) {
            return (size_t)pbVar13;
          }
          if (pbVar13 != (byte *)0x0) {
            pbVar8 = pbVar8 + (long)pbVar13;
            bVar31 = 0x39 < (local_230->appliedParams).cParams.windowLog;
            if (local_218 - (long)pbVar8 < 4) {
              return (size_t)(byte *)0xffffffffffffffba;
            }
            if (0x7e < nbSeq) {
              if (nbSeq < 0x7f00) {
                *pbVar8 = (byte)(nbSeq >> 8) | 0x80;
                pbVar8[1] = (byte)nbSeq;
                pbVar13 = pbVar8 + 2;
              }
              else {
                *pbVar8 = 0xff;
                *(short *)(pbVar8 + 1) = (short)nbSeq + -0x7f00;
                pbVar13 = pbVar8 + 3;
              }
LAB_0069545d:
              local_210 = CONCAT44(local_210._4_4_,(int)workspace_00);
              pbVar20 = pbVar13 + 1;
              if (bVar3) {
                *pbVar13 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                           (char)(entropyMetadata.fseMetadata.llType << 6) +
                           (char)entropyMetadata.fseMetadata.mlType * '\x04';
                memcpy(pbVar20,entropyMetadata.fseMetadata.fseTablesBuffer,
                       entropyMetadata.fseMetadata.fseTablesSize);
                pbVar20 = pbVar20 + entropyMetadata.fseMetadata.fseTablesSize;
                workspace_00 = (U8 *)local_1f8;
                pbVar14 = (byte *)ZSTD_encodeSequences
                                            (pbVar20,local_218 - (long)pbVar20,local_1d0,local_1f0,
                                             local_1c0->offcodeCTable,(BYTE *)local_1f8,local_1c8,
                                             local_1e8,sequences,nbSeq,(uint)bVar31,(int)local_1a0);
                if ((byte *)0xffffffffffffff88 < pbVar14) {
                  return (size_t)pbVar14;
                }
                pbVar20 = pbVar20 + (long)pbVar14;
                if ((entropyMetadata.fseMetadata.lastCountSize != 0) &&
                   (pbVar14 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4)) {
                  pFVar16 = (FSE_CTable *)(ulong)uVar34;
                  zc = local_230;
                  if (pbVar14 + entropyMetadata.fseMetadata.lastCountSize != (byte *)0x3) {
                    __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                                  ,0xe7,
                                  "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int, int *)"
                                 );
                  }
                  goto LAB_006956e7;
                }
              }
              else {
                *pbVar13 = 0xfc;
                workspace_00 = (U8 *)local_1f8;
                pbVar14 = (byte *)ZSTD_encodeSequences
                                            (pbVar20,local_218 - (long)pbVar20,local_1d0,local_1f0,
                                             local_1c0->offcodeCTable,(BYTE *)local_1f8,local_1c8,
                                             local_1e8,sequences,nbSeq,(uint)bVar31,(int)local_1a0);
                if ((byte *)0xffffffffffffff88 < pbVar14) {
                  return (size_t)pbVar14;
                }
                pbVar20 = pbVar20 + (long)pbVar14;
              }
              pFVar16 = (FSE_CTable *)(ulong)uVar34;
              zc = local_230;
              if (3 < (long)pbVar20 - (long)pbVar13) {
                pbVar20 = pbVar20 + -(long)pbVar8;
                if ((byte *)0xffffffffffffff88 < pbVar20) {
                  return (size_t)pbVar20;
                }
                if (pbVar20 != (byte *)0x0) {
                  bVar31 = false;
                  workspace_00 = (U8 *)(local_210 & 0xffffffff);
                  goto LAB_00695628;
                }
              }
              goto LAB_006956e7;
            }
            *pbVar8 = (byte)nbSeq;
            if (nbSeq != 0) {
              pbVar13 = pbVar8 + 1;
              goto LAB_0069545d;
            }
            pbVar20 = (byte *)0x1;
            bVar31 = true;
            pFVar16 = (FSE_CTable *)(ulong)uVar34;
LAB_00695628:
            pbVar13 = pbVar8 + (long)pbVar20 + -(long)local_228;
            iVar7 = (bVar33 & (byte)pFVar16 | 0xffffffec) + (int)pbVar13 * 8;
            *(short *)local_228 = (short)iVar7;
            local_228[2] = (byte)((uint)iVar7 >> 0x10);
            if ((byte *)0xffffffffffffff88 < pbVar13) {
              return (size_t)pbVar13;
            }
            if ((pbVar13 != (byte *)0x0) && (pbVar13 < (byte *)(lVar29 + uVar30))) {
              local_1d8 = (void *)((long)local_1d8 + (long)(lVar29 + uVar30));
              if (local_1a8 < local_1d8) {
                __assert_fail("ip + decompressedSize <= iend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                              ,0x1f7,
                              "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                             );
              }
              local_248 = local_248 + uVar30;
              local_1e8 = local_1e8 + nbSeq;
              local_1f0 = local_1f0 + nbSeq;
              local_1f8 = (U32 *)((long)local_1f8 + nbSeq);
              if ((char)workspace_00 == '\0') {
                bVar32 = false;
              }
              if (!bVar31) {
                bVar3 = false;
              }
              nbSeq = 0;
              uVar30 = 0;
              sequences = local_1e0;
              local_228 = pbVar8 + (long)pbVar20;
              goto LAB_006956e3;
            }
          }
          pFVar16 = (FSE_CTable *)(ulong)uVar34;
          zc = local_230;
        }
      }
    }
LAB_006956e7:
    psVar21 = local_220;
  } while ((char)pFVar16 == '\0');
  if (bVar32) {
    memcpy(local_208,local_1b0,0x810);
  }
  pvVar5 = local_178;
  if ((bVar3) &&
     (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
       (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
      (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
    local_228 = (byte *)0x0;
  }
  else {
    if (local_1d8 < local_1a8) {
      __n = (long)local_1a8 - (long)local_1d8;
      pbVar8 = (byte *)(__n + 3);
      if ((byte *)(local_218 - (long)local_228) < pbVar8) {
        return (size_t)(byte *)0xffffffffffffffba;
      }
      iVar7 = (int)local_198 + (int)__n * 8;
      *(short *)local_228 = (short)iVar7;
      local_228[2] = (byte)((uint)iVar7 >> 0x10);
      memcpy(local_228 + 3,local_1d8,__n);
      if ((byte *)0xffffffffffffff88 < pbVar8) {
        return (size_t)pbVar8;
      }
      if (pbVar8 == (byte *)0x0) {
        __assert_fail("cSize != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                      ,0x21a,
                      "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                     );
      }
      local_228 = local_228 + (long)pbVar8;
      if (sequences < local_180) {
        UVar24 = local_1b0->rep[2];
        local_238 = UVar24;
        local_240 = *(undefined8 *)local_1b0->rep;
        uVar4 = local_240;
        if (psVar21 < sequences) {
          local_240._4_4_ = (U32)((ulong)local_240 >> 0x20);
          uVar30 = (long)psVar21 - (long)(zc->seqStore).sequencesStart;
          UVar15 = (uint)local_240;
          UVar17 = local_240._4_4_;
          local_240 = uVar4;
          do {
            uVar1 = psVar21->litLength;
            uVar34 = (uint)uVar1;
            if (((zc->seqStore).longLengthPos == (U32)(uVar30 >> 3)) &&
               (uVar34 = uVar1 + 0x10000, (zc->seqStore).longLengthType != ZSTD_llt_literalLength))
            {
              uVar34 = (uint)uVar1;
            }
            uVar27 = psVar21->offBase;
            if (uVar27 < 4) {
              if (uVar27 == 0) {
                __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
              }
              uVar34 = (uVar27 + (uVar34 == 0)) - 1;
              UVar26 = UVar15;
              UVar6 = UVar17;
              if (uVar34 != 0) {
                if (uVar34 == 3) {
                  UVar26 = UVar15 - 1;
                }
                else {
                  UVar26 = *(U32 *)((long)&local_240 + (ulong)uVar34 * 4);
                }
                if (uVar34 == 1) {
                  UVar17 = UVar24;
                }
                local_238 = UVar17;
                goto LAB_0069597d;
              }
            }
            else {
              local_238 = UVar17;
              UVar26 = uVar27 - 3;
LAB_0069597d:
              local_240 = CONCAT44(UVar15,UVar26);
              UVar6 = UVar15;
              UVar24 = UVar17;
              local_238 = UVar17;
            }
            UVar17 = UVar6;
            UVar15 = UVar26;
            psVar21 = psVar21 + 1;
            uVar30 = uVar30 + 8;
          } while (psVar21 < sequences);
        }
        local_208->rep[2] = local_238;
        *(undefined8 *)local_208->rep = local_240;
      }
    }
    local_228 = local_228 + -(long)pvVar5;
  }
  return (size_t)local_228;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}